

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void charFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  byte *z;
  char *pcVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    z = (byte *)sqlite3Malloc((long)(argc * 4 + 1));
  }
  else {
    z = (byte *)0x0;
  }
  if (z != (byte *)0x0) {
    pbVar6 = z;
    if (0 < argc) {
      uVar5 = 0;
      do {
        pcVar2 = (char *)sqlite3VdbeIntValue(argv[uVar5]);
        uVar4 = (uint)pcVar2 & 0x1fffff;
        if ("NS0_25add_miss_candidates_afterERKNS_6detail20scoped_dfs_traverserEEUlRKNS_5group21depth_first_traverserEE_EEvS7_OT_"
            < pcVar2) {
          uVar4 = 0xfffd;
        }
        bVar3 = (byte)uVar4;
        if (uVar4 < 0x80) {
          *pbVar6 = bVar3;
          pbVar6 = pbVar6 + 1;
        }
        else if (uVar4 < 0x800) {
          *pbVar6 = (byte)(uVar4 >> 6) | 0xc0;
          pbVar6[1] = bVar3 & 0x3f | 0x80;
          pbVar6 = pbVar6 + 2;
        }
        else if (uVar4 < 0x10000) {
          *pbVar6 = (byte)(uVar4 >> 0xc) | 0xe0;
          pbVar6[1] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
          pbVar6[2] = bVar3 & 0x3f | 0x80;
          pbVar6 = pbVar6 + 3;
        }
        else {
          *pbVar6 = (byte)(uVar4 >> 0x12) | 0xf0;
          pbVar6[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
          pbVar6[2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
          pbVar6[3] = bVar3 & 0x3f | 0x80;
          pbVar6 = pbVar6 + 4;
        }
        uVar5 = uVar5 + 1;
      } while ((uint)argc != uVar5);
    }
    sqlite3_result_text64(context,(char *)z,(long)pbVar6 - (long)z,sqlite3_free,'\x01');
    return;
  }
  sqlite3_result_error_nomem(context);
  return;
}

Assistant:

static void charFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  unsigned char *z, *zOut;
  int i;
  zOut = z = sqlite3_malloc64( argc*4+1 );
  if( z==0 ){
    sqlite3_result_error_nomem(context);
    return;
  }
  for(i=0; i<argc; i++){
    sqlite3_int64 x;
    unsigned c;
    x = sqlite3_value_int64(argv[i]);
    if( x<0 || x>0x10ffff ) x = 0xfffd;
    c = (unsigned)(x & 0x1fffff);
    if( c<0x00080 ){
      *zOut++ = (u8)(c&0xFF);
    }else if( c<0x00800 ){
      *zOut++ = 0xC0 + (u8)((c>>6)&0x1F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else if( c<0x10000 ){
      *zOut++ = 0xE0 + (u8)((c>>12)&0x0F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else{
      *zOut++ = 0xF0 + (u8)((c>>18) & 0x07);
      *zOut++ = 0x80 + (u8)((c>>12) & 0x3F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }                                                    \
  }
  sqlite3_result_text64(context, (char*)z, zOut-z, sqlite3_free, SQLITE_UTF8);
}